

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-contact-ekf-flex-estimator-imu.cpp
# Opt level: O0

Vector * __thiscall
stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::getFlexibilityVector
          (FixedContactEKFFlexEstimatorIMU *this)

{
  uint uVar1;
  Vector *other;
  Vector *this_00;
  Type local_a8;
  EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> local_70 [56];
  Matrix<double,3,1,0,3,1> local_38 [24];
  Matrix<double,__1,_1,_0,__1,_1> local_20;
  FixedContactEKFFlexEstimatorIMU *local_10;
  FixedContactEKFFlexEstimatorIMU *this_local;
  
  local_10 = this;
  uVar1 = ZeroDelayObserver::getMeasurementsNumber
                    ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
  if (uVar1 != 0) {
    other = EKFFlexibilityEstimatorBase::getFlexibilityVector
                      (&this->super_EKFFlexibilityEstimatorBase);
    this_00 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(this_00,other);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)local_70,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,3,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>(local_38,local_70);
    kine::regulateOrientationVector((kine *)&local_20,(Vector3 *)local_38);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_a8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,3,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_a8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_20);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_20);
    uVar1 = ZeroDelayObserver::getCurrentTime
                      ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
    ZeroDelayObserver::setState
              ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,
               &(this->super_EKFFlexibilityEstimatorBase).lastX_,uVar1);
  }
  return &(this->super_EKFFlexibilityEstimatorBase).lastX_;
}

Assistant:

const Vector& FixedContactEKFFlexEstimatorIMU::getFlexibilityVector()
    {
        if (ekf_.getMeasurementsNumber()>0)
        {
            lastX_ =EKFFlexibilityEstimatorBase::getFlexibilityVector();

            ///regulate the part of orientation vector in the state vector
            lastX_.segment(kine::ori,3)=
                kine::regulateOrientationVector(lastX_.segment(kine::ori,3));

            ekf_.setState(lastX_,ekf_.getCurrentTime());
        }
        return lastX_;
    }